

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::find_node<NULLCPugiXML::predicate_nullc_node>
          (xml_node *this,predicate_nullc_node pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  xml_node xVar3;
  xml_node cur;
  xml_node local_48;
  xml_node local_40;
  xml_node local_38;
  predicate_nullc_node local_30;
  
  local_30.callback.id = pred.callback.id;
  local_30.callback.context = pred.callback.context;
  if (((this->_root != (xml_node_struct *)0x0) &&
      (local_48 = first_child(this), local_48._root != (xml_node_struct *)0x0)) &&
     (local_48._root != this->_root)) {
    do {
      bVar1 = NULLCPugiXML::predicate_nullc_node::operator()(&local_30,&local_48);
      if (bVar1) {
        return (xml_node)local_48._root;
      }
      local_40 = first_child(&local_48);
      p_Var2 = operator_cast_to_function_pointer(&local_40);
      if (p_Var2 == (unspecified_bool_type)0x0) {
        local_40 = next_sibling(&local_48);
        p_Var2 = operator_cast_to_function_pointer(&local_40);
        if (p_Var2 == (unspecified_bool_type)0x0) {
          while( true ) {
            local_40 = next_sibling(&local_48);
            bVar1 = operator!(&local_40);
            if (!bVar1) break;
            xVar3._root = local_48._root;
            if (local_48._root == this->_root) goto LAB_0022c2c0;
            local_48 = parent(&local_48);
          }
          xVar3._root = this->_root;
          if (local_48._root == this->_root) goto LAB_0022c2c0;
        }
        xVar3 = next_sibling(&local_48);
        local_48 = xVar3;
      }
      else {
        xVar3 = first_child(&local_48);
        local_48 = xVar3;
      }
LAB_0022c2c0:
    } while ((xVar3._root != (xml_node_struct *)0x0) && (xVar3._root != this->_root));
  }
  xml_node(&local_38);
  return (xml_node)local_38._root;
}

Assistant:

xml_node find_node(Predicate pred) const
		{
			if (!_root) return xml_node();

			xml_node cur = first_child();

			while (cur._root && cur._root != _root)
			{
				if (pred(cur)) return cur;

				if (cur.first_child()) cur = cur.first_child();
				else if (cur.next_sibling()) cur = cur.next_sibling();
				else
				{
					while (!cur.next_sibling() && cur._root != _root) cur = cur.parent();

					if (cur._root != _root) cur = cur.next_sibling();
				}
			}

			return xml_node();
		}